

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_map.c
# Opt level: O3

void ht_hash_map_for_each
               (HT_HashMap *hash_map,_func_HT_Boolean_uint64_t_char_ptr_void_ptr *callback,void *ud)

{
  HT_Boolean HVar1;
  ulong uVar2;
  size_t i;
  long lVar3;
  
  lVar3 = 0;
  do {
    if (hash_map->buckets[lVar3].key_bag.size != 0) {
      uVar2 = 0;
      do {
        HVar1 = (*callback)(hash_map->buckets[lVar3].key_bag.data[uVar2],
                            (char *)hash_map->buckets[lVar3].value_bag.data[uVar2],ud);
        if (HVar1 == 0) {
          return;
        }
        uVar2 = uVar2 + 1;
      } while (uVar2 < hash_map->buckets[lVar3].key_bag.size);
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x200);
  return;
}

Assistant:

void ht_hash_map_for_each(HT_HashMap* hash_map, HT_Boolean(*callback)(uint64_t, const char*, void* ud), void* ud)
{
    for (size_t i = 0; i < BUCKET_COUNT(hash_map); i++)
    {
        if (!ht_hash_bucket_for_each(&hash_map->buckets[i], callback, ud))
        {
            return;
        }
    }
}